

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall DifferingTypesTest::typePromotionTest(DifferingTypesTest *this)

{
  uchar uVar1;
  byte *pbVar2;
  reference piVar3;
  reference puVar4;
  logic_error *plVar5;
  size_t value;
  size_t shape [2];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> a;
  Marray<int,_std::allocator<unsigned_long>_> b;
  allocator_type local_f1;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Plus<int,_unsigned_char,_int>_>
  local_f0;
  unsigned_long local_d8 [3];
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> local_c0;
  Marray<int,std::allocator<unsigned_long>> local_78;
  undefined7 uStack_77;
  void *local_68;
  long local_50;
  long local_48;
  
  local_d8[0] = 3;
  local_d8[1] = 4;
  local_78 = (Marray<int,std::allocator<unsigned_long>>)0xfa;
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)&local_c0,local_d8,local_d8 + 2,
             (uchar *)&local_78,&andres::defaultOrder,(allocator_type *)&local_f0);
  local_f0.e1_._0_4_ = 1000;
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            (&local_78,local_d8,local_d8 + 2,(int *)&local_f0,&andres::defaultOrder,&local_f1);
  if (local_c0.geometry_.size_ != 0) {
    value = 0;
    do {
      andres::
      BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<unsigned_char,_int,_int>_>
      ::BinaryViewExpression
                ((BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<unsigned_char,_int,_int>_>
                  *)&local_f0,
                 (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                  *)&local_c0,
                 (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                 &local_78);
      pbVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)
                          CONCAT44(local_f0.e1_._4_4_,local_f0.e1_._0_4_),value);
      piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0.e2_,value);
      if ((uint)*pbVar2 + *piVar3 != 0x4e2) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"test failed.");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::
      BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<unsigned_char,_int,_int>_>
      ::BinaryViewExpression
                ((BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<unsigned_char,_int,_int>_>
                  *)&local_f0,
                 (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                  *)&local_c0,
                 (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                 &local_78);
      pbVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)
                          CONCAT44(local_f0.e1_._4_4_,local_f0.e1_._0_4_),value);
      piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0.e2_,value);
      if ((uint)*pbVar2 - *piVar3 != -0x2ee) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"test failed.");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::
      BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Plus<int,_unsigned_char,_int>_>
      ::BinaryViewExpression
                (&local_f0,
                 (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                 &local_78,
                 (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                  *)&local_c0);
      piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)
                          CONCAT44(local_f0.e1_._4_4_,local_f0.e1_._0_4_),value);
      pbVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         (local_f0.e2_,value);
      if ((uint)*pbVar2 + *piVar3 != 0x4e2) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"test failed.");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::
      BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Minus<int,_unsigned_char,_int>_>
      ::BinaryViewExpression
                ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Minus<int,_unsigned_char,_int>_>
                  *)&local_f0,
                 (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                 &local_78,
                 (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                  *)&local_c0);
      piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)
                          CONCAT44(local_f0.e1_._4_4_,local_f0.e1_._0_4_),value);
      pbVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         (local_f0.e2_,value);
      if (*piVar3 - (uint)*pbVar2 != 0x2ee) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"test failed.");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      puVar4 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         (&local_c0,value);
      uVar1 = *puVar4;
      puVar4 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         (&local_c0,value);
      if (uVar1 != *puVar4) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"test failed.");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      puVar4 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         (&local_c0,value);
      uVar1 = *puVar4;
      puVar4 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         (&local_c0,value);
      if (uVar1 != *puVar4) {
        plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar5,"test failed.");
        __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      value = value + 1;
    } while (value < local_c0.geometry_.size_);
  }
  operator_delete((void *)CONCAT71(uStack_77,local_78),local_48 << 2);
  operator_delete(local_68,local_50 * 0x18);
  operator_delete(local_c0.data_,local_c0.geometry_.size_);
  operator_delete(local_c0.geometry_.shape_,local_c0.geometry_.dimension_ * 0x18);
  return;
}

Assistant:

void DifferingTypesTest::typePromotionTest()
{
    std::size_t shape[] = {3, 4};
    andres::Marray<unsigned char> a(shape, shape + 2, 250);
    andres::Marray<int> b(shape, shape + 2, 1000);
    for(std::size_t j=0; j<a.size(); ++j) {
        test((a + b)(j) == 1250);
        test((a - b)(j) == -750);
        test((b + a)(j) == 1250);
        test((b - a)(j) == 750);
        test((4 * a)(j) == 4 * a(j));
        test((a * 4)(j) == a(j) * 4);
    }
}